

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STVar.cpp
# Opt level: O0

STVar * __thiscall jbcoin::detail::STVar::operator=(STVar *this,STVar *rhs)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  STVar *rhs_local;
  STVar *this_local;
  
  if (rhs != this) {
    destroy(this);
    bVar1 = on_heap(rhs);
    if (bVar1) {
      this->p_ = rhs->p_;
      rhs->p_ = (STBase *)0x0;
    }
    else {
      iVar2 = (*rhs->p_->_vptr_STBase[3])(rhs->p_,0x48,this);
      this->p_ = (STBase *)CONCAT44(extraout_var,iVar2);
    }
  }
  return this;
}

Assistant:

STVar&
STVar::operator= (STVar&& rhs)
{
    if (&rhs != this)
    {
        destroy();
        if (rhs.on_heap())
        {
            p_ = rhs.p_;
            rhs.p_ = nullptr;
        }
        else
        {
            p_ = rhs.p_->move(max_size, &d_);
        }
    }

    return *this;
}